

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DUI.h
# Opt level: O3

_Bool DUI_Button(char *text)

{
  size_t sVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  byte bVar5;
  uint8_t *puVar6;
  SDL_Point SVar7;
  SDL_Rect bounds;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  sVar1 = strlen(text);
  local_20 = (int)sVar1 * _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_1c = _duiStyle.CharSize + _duiStyle.ButtonPadding * 2;
  local_28 = _duiCursor.x;
  local_24 = _duiCursor.y;
  puVar2 = _duiStyle.ColorDefault + 3;
  puVar3 = _duiStyle.ColorDefault + 2;
  puVar4 = _duiStyle.ColorDefault + 1;
  puVar6 = _duiStyle.ColorDefault;
  bVar5 = 0;
  if ((_duiCursor.x <= _duiMouse.x) && (bVar5 = 0, _duiMouse.x < _duiCursor.x + local_20)) {
    if (_duiMouse.y < local_1c + _duiCursor.y && _duiCursor.y <= _duiMouse.y) {
      puVar2 = _duiStyle.ColorHover + 3;
      puVar3 = _duiStyle.ColorHover + 2;
      puVar4 = _duiStyle.ColorHover + 1;
      puVar6 = _duiStyle.ColorHover;
      bVar5 = _duiClicked;
    }
    else {
      bVar5 = 0;
    }
  }
  SDL_SetRenderDrawColor(_duiRenderer,*puVar6,*puVar4,*puVar3,*puVar2);
  SDL_RenderFillRect(_duiRenderer,&local_28);
  SDL_SetRenderDrawColor
            (_duiRenderer,_duiStyle.ColorBorder[0],_duiStyle.ColorBorder[1],_duiStyle.ColorBorder[2]
             ,_duiStyle.ColorBorder[3]);
  SDL_RenderDrawRect(_duiRenderer,&local_28);
  SVar7.x = _duiStyle.ButtonPadding + _duiCursor.x;
  SVar7.y = _duiStyle.ButtonPadding + _duiCursor.y;
  _duiCursor = SVar7;
  DUI_Print("%s",text);
  _duiCursor.y = local_24;
  _duiCursor.x = local_20 + local_28 + _duiStyle.ButtonMargin;
  return (_Bool)(bVar5 & 1);
}

Assistant:

bool DUI_Button(const char * text)
{
    int width = (strlen(text) * _duiStyle.CharSize) 
        + (_duiStyle.ButtonPadding * 2);

    int height = _duiStyle.CharSize 
        + (_duiStyle.ButtonPadding * 2);

    SDL_Rect bounds = {
        .x = _duiCursor.x,
        .y = _duiCursor.y,
        .w = width,
        .h = height,
    };

    bool hover = SDL_PointInRect(&_duiMouse, &bounds);
    bool clicked = (hover && _duiClicked);

    if (hover) {
        DUI_setColorHover();
    }
    else {
        DUI_setColorDefault();
    }

    SDL_RenderFillRect(_duiRenderer, &bounds);

    DUI_setColorBorder();
    SDL_RenderDrawRect(_duiRenderer, &bounds);

    _duiCursor.x += _duiStyle.ButtonPadding;
    _duiCursor.y += _duiStyle.ButtonPadding;

    DUI_Print("%s", text);

    _duiCursor.x = bounds.x + bounds.w + _duiStyle.ButtonMargin;
    _duiCursor.y = bounds.y;

    return clicked;
}